

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O3

event_process_result __thiscall
afsm::
state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>::
process_event<afsm::test::events::error>
          (state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
           *this,error *event)

{
  __atomic_flag_data_type _Var1;
  event_process_result eVar2;
  id_type *local_28;
  anon_class_16_2_20c42392 local_20;
  
  if ((this->queue_size_).super___atomic_base<unsigned_long>._M_i == 0) {
    LOCK();
    _Var1 = (this->is_top_).super___atomic_flag_base._M_i;
    (this->is_top_).super___atomic_flag_base._M_i = true;
    UNLOCK();
    if (_Var1 == false) {
      eVar2 = process_event_impl<afsm::test::events::error>
                        (this,event,
                         (process_type<actions::event_process_result::process> *)&local_20);
      LOCK();
      (this->is_top_).super___atomic_flag_base._M_i = false;
      UNLOCK();
      goto LAB_0034cd49;
    }
  }
  LOCK();
  (this->queue_size_).super___atomic_base<unsigned_long>._M_i =
       (this->queue_size_).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  local_28 = (id_type *)&detail::event<afsm::test::events::error>::id;
  local_20.this = this;
  std::
  deque<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>>>
  ::
  emplace_back<afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>::enqueue_event<afsm::test::events::error>(afsm::test::events::error&&)::_lambda()_1_,afsm::detail::event_base::id_type_const*>
            ((deque<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>>>
              *)&this->queued_events_,&local_20,&local_28);
  eVar2 = defer;
LAB_0034cd49:
  process_event_queue(this);
  return eVar2;
}

Assistant:

actions::event_process_result
    process_event( Event&& event )
    {
        if (!queue_size_ && !is_top_.test_and_set()) {
            auto res = process_event_dispatch(::std::forward<Event>(event));
            is_top_.clear();
            // Process enqueued events
            process_event_queue();
            return res;
        } else {
            // Enqueue event
            enqueue_event(::std::forward<Event>(event));
            return actions::event_process_result::defer;
        }
    }